

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# univalue_read.cpp
# Opt level: O1

ssize_t __thiscall UniValue::read(UniValue *this,int __fd,void *__buf,size_t __nbytes)

{
  uint uVar1;
  string *this_00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_01;
  vector<UniValue,_std::allocator<UniValue>_> *this_02;
  UniValue *pUVar2;
  bool bVar3;
  UniValue **ppUVar4;
  iterator iVar5;
  jtokentype jVar6;
  jtokentype jVar7;
  ulong uVar8;
  char *end;
  ulong uVar9;
  undefined4 in_register_00000034;
  byte bVar10;
  byte bVar11;
  long in_FS_OFFSET;
  bool bVar12;
  UniValue *newTop;
  uint consumed;
  vector<UniValue_*,_std::allocator<UniValue_*>_> stack;
  UniValue tmpVal;
  string tokenVal;
  pointer local_138;
  uint local_12c;
  UniValue **local_128;
  iterator iStack_120;
  UniValue **local_118;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_110;
  size_type local_108;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_100;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_f0;
  size_type local_e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e0;
  undefined1 *local_d0;
  undefined8 local_c8;
  undefined1 local_c0;
  uint7 uStack_bf;
  undefined8 uStack_b8;
  value_type local_b0;
  string local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  clear(this);
  local_118 = (UniValue **)0x0;
  local_128 = (UniValue **)0x0;
  iStack_120._M_current = (UniValue **)0x0;
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  local_58._M_string_length = 0;
  local_58.field_2._M_local_buf[0] = '\0';
  end = (char *)(CONCAT44(in_register_00000034,__fd) + (long)__buf);
  this_00 = &this->val;
  this_01 = &this->keys;
  this_02 = &this->values;
  bVar11 = 0;
  bVar3 = false;
  jVar7 = JTOK_NONE;
  do {
    jVar6 = getJsonToken(&local_58,&local_12c,(char *)__buf,end);
    if ((uint)(jVar6 + JTOK_OBJ_OPEN) < 2) goto LAB_001e6fb3;
    uVar9 = (ulong)local_12c;
    uVar1 = jVar6 + ~JTOK_COMMA;
    bVar10 = bVar11;
    if ((bVar11 & 8) != 0) {
      if ((4 < uVar1) && ((jVar6 | JTOK_OBJ_CLOSE) != JTOK_ARR_OPEN)) goto switchD_001e6919_default;
      bVar11 = bVar11 & 0xf7;
      goto LAB_001e68f5;
    }
    if ((bVar11 & 4) == 0) {
      if (bVar3) {
        if ((jVar6 == JTOK_OBJ_CLOSE) || (jVar6 == JTOK_STRING)) goto LAB_001e68f5;
      }
      else if ((bVar11 & 2) == 0) {
        if (jVar6 != JTOK_COLON) goto LAB_001e68f5;
      }
      else if (jVar6 == JTOK_COLON) {
        bVar11 = bVar11 & 0xf0;
        bVar3 = false;
        goto LAB_001e68f5;
      }
      goto switchD_001e6919_default;
    }
    if ((uVar1 < 5) || (((uint)jVar6 < 5 && ((0x1aU >> (jVar6 & 0x1f) & 1) != 0)))) {
      bVar11 = bVar11 & 0xf3;
    }
    if (4 < uVar1) {
      bVar12 = false;
      if (((uint)jVar6 < 5) && (bVar12 = false, (0x1aU >> (jVar6 & 0x1f) & 1) != 0))
      goto LAB_001e68f5;
      goto LAB_001e6f7a;
    }
LAB_001e68f5:
    bVar10 = bVar11;
    if ((bVar11 & 0x10) != 0) {
      if ((uVar1 < 5) || ((jVar6 | JTOK_OBJ_CLOSE) == JTOK_ARR_OPEN)) goto switchD_001e6919_default;
      bVar10 = bVar11 & 0xef;
    }
    bVar11 = bVar10;
    switch(jVar6) {
    case JTOK_OBJ_OPEN:
    case JTOK_ARR_OPEN:
      if (iStack_120._M_current == local_128) {
        if (jVar6 == JTOK_OBJ_OPEN) {
          setObject(this);
        }
        else {
          setArray(this);
        }
        local_b0._0_8_ = this;
        std::vector<UniValue*,std::allocator<UniValue*>>::emplace_back<UniValue*>
                  ((vector<UniValue*,std::allocator<UniValue*>> *)&local_128,(UniValue **)&local_b0)
        ;
      }
      else {
        local_d0 = &local_c0;
        local_b0.typ = (jVar6 != JTOK_OBJ_OPEN) + 1;
        local_b0.val._M_dataplus._M_p = (pointer)&local_b0.val.field_2;
        local_b0.val.field_2._M_allocated_capacity = (ulong)uStack_bf << 8;
        local_b0.val.field_2._8_8_ = uStack_b8;
        local_b0.val._M_string_length = 0;
        local_c8 = 0;
        local_c0 = 0;
        local_b0.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_b0.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_b0.keys.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_b0.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_b0.keys.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_b0.keys.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        pUVar2 = iStack_120._M_current[-1];
        std::vector<UniValue,_std::allocator<UniValue>_>::push_back(&pUVar2->values,&local_b0);
        local_138 = (pUVar2->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl
                    .super__Vector_impl_data._M_finish + -1;
        if (iStack_120._M_current == local_118) {
          std::vector<UniValue*,std::allocator<UniValue*>>::_M_realloc_insert<UniValue*const&>
                    ((vector<UniValue*,std::allocator<UniValue*>> *)&local_128,iStack_120,&local_138
                    );
        }
        else {
          *iStack_120._M_current = local_138;
          iStack_120._M_current = iStack_120._M_current + 1;
        }
        std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_b0.values);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_b0.keys);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0.val._M_dataplus._M_p != &local_b0.val.field_2) {
          operator_delete(local_b0.val._M_dataplus._M_p,
                          local_b0.val.field_2._M_allocated_capacity + 1);
        }
      }
      uVar8 = (long)iStack_120._M_current - (long)local_128;
      bVar12 = false;
      bVar11 = (jVar6 != JTOK_OBJ_OPEN) * '\x03' + 1;
      if (0x1000 < uVar8) {
        bVar11 = 0;
      }
      bVar11 = bVar10 | bVar11;
      bVar3 = (bool)(bVar3 | (0x1000 >= uVar8 && jVar6 == JTOK_OBJ_OPEN));
      if (0x1000 < uVar8) goto LAB_001e6f7a;
      break;
    case JTOK_OBJ_CLOSE:
    case JTOK_ARR_CLOSE:
      bVar12 = false;
      if ((jVar7 == JTOK_COMMA) || (iStack_120._M_current == local_128)) goto LAB_001e6f7a;
      if ((jVar6 != JTOK_OBJ_CLOSE) + VOBJ != iStack_120._M_current[-1]->typ)
      goto switchD_001e6919_default;
      iStack_120._M_current = iStack_120._M_current + -1;
      bVar11 = bVar10 & 0xee | 0x10;
      bVar3 = false;
      break;
    case JTOK_COLON:
      if (iStack_120._M_current != local_128) {
        bVar11 = bVar10 | 8;
        if (iStack_120._M_current[-1]->typ == VOBJ) break;
      }
    default:
switchD_001e6919_default:
      bVar12 = false;
      bVar11 = bVar10;
      goto LAB_001e6f7a;
    case JTOK_COMMA:
      if (iStack_120._M_current == local_128) goto switchD_001e6919_default;
      bVar12 = false;
      if ((jVar7 == JTOK_ARR_OPEN) || (jVar7 == JTOK_COMMA)) goto LAB_001e6f7a;
      bVar12 = iStack_120._M_current[-1]->typ != VOBJ;
      bVar11 = bVar10 | bVar12 * '\x03' + 1U;
      bVar3 = (bool)(bVar3 | !bVar12);
      break;
    case JTOK_KW_NULL:
    case JTOK_KW_TRUE:
    case JTOK_KW_FALSE:
      local_b0.val._M_dataplus._M_p = (pointer)&local_b0.val.field_2;
      local_b0.val._M_string_length = 0;
      local_b0.val.field_2._M_allocated_capacity =
           local_b0.val.field_2._M_allocated_capacity & 0xffffffffffffff00;
      local_b0._0_8_ = (ulong)(uint)local_b0._4_4_ << 0x20;
      local_b0.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_b0.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_b0.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_b0.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_b0.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_b0.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      if (jVar6 == JTOK_KW_FALSE) {
        bVar12 = false;
LAB_001e6b3e:
        setBool(&local_b0,bVar12);
      }
      else if (jVar6 == JTOK_KW_TRUE) {
        bVar12 = true;
        goto LAB_001e6b3e;
      }
      if (iStack_120._M_current == local_128) {
        this->typ = local_b0.typ;
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                  (this_00,&local_b0.val);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator=(this_01,&local_b0.keys);
        std::vector<UniValue,_std::allocator<UniValue>_>::operator=(this_02,&local_b0.values);
      }
      else {
        std::vector<UniValue,_std::allocator<UniValue>_>::push_back
                  (&iStack_120._M_current[-1]->values,&local_b0);
LAB_001e6df1:
        bVar11 = bVar10 | 0x10;
      }
      goto LAB_001e6df5;
    case JTOK_NUMBER:
      local_f0 = &local_e0;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_f0,local_58._M_dataplus._M_p,
                 local_58._M_dataplus._M_p + local_58._M_string_length);
      local_b0.typ = 4;
      local_b0.val._M_dataplus._M_p = (pointer)&local_b0.val.field_2;
      if (local_f0 == &local_e0) {
        local_b0.val.field_2._8_8_ = local_e0._8_8_;
      }
      else {
        local_b0.val._M_dataplus._M_p = (pointer)local_f0;
      }
      local_b0.val.field_2._M_allocated_capacity._1_7_ = local_e0._M_allocated_capacity._1_7_;
      local_b0.val.field_2._M_local_buf[0] = local_e0._M_local_buf[0];
      local_b0.val._M_string_length = local_e8;
      local_e8 = 0;
      local_e0._M_local_buf[0] = '\0';
      local_b0.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_b0.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_b0.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_b0.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_b0.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_b0.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      if (iStack_120._M_current != local_128) {
        local_f0 = &local_e0;
        std::vector<UniValue,_std::allocator<UniValue>_>::push_back
                  (&iStack_120._M_current[-1]->values,&local_b0);
        goto LAB_001e6df1;
      }
      this->typ = VNUM;
      local_f0 = &local_e0;
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                (this_00,&local_b0.val);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator=(this_01,&local_b0.keys);
      std::vector<UniValue,_std::allocator<UniValue>_>::operator=(this_02,&local_b0.values);
LAB_001e6df5:
      std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_b0.values);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_b0.keys);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0.val._M_dataplus._M_p != &local_b0.val.field_2) {
        operator_delete(local_b0.val._M_dataplus._M_p,local_b0.val.field_2._M_allocated_capacity + 1
                       );
      }
      break;
    case JTOK_STRING:
      if (bVar3) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&iStack_120._M_current[-1]->keys,&local_58);
        bVar10 = bVar10 & 0xfc | 2;
        bVar3 = false;
      }
      else {
        local_110 = &local_100;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_110,local_58._M_dataplus._M_p,
                   local_58._M_dataplus._M_p + local_58._M_string_length);
        iVar5._M_current = iStack_120._M_current;
        ppUVar4 = local_128;
        local_b0.typ = 3;
        local_b0.val._M_dataplus._M_p = (pointer)&local_b0.val.field_2;
        if (local_110 == &local_100) {
          local_b0.val.field_2._8_8_ = local_100._8_8_;
        }
        else {
          local_b0.val._M_dataplus._M_p = (pointer)local_110;
        }
        local_b0.val.field_2._M_allocated_capacity._1_7_ = local_100._M_allocated_capacity._1_7_;
        local_b0.val.field_2._M_local_buf[0] = local_100._M_local_buf[0];
        local_b0.val._M_string_length = local_108;
        local_108 = 0;
        local_100._M_local_buf[0] = '\0';
        local_b0.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_b0.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_b0.keys.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_b0.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_b0.keys.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_b0.keys.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        if (iStack_120._M_current == local_128) {
          this->typ = VSTR;
          local_110 = &local_100;
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                    (this_00,&local_b0.val);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator=(this_01,&local_b0.keys);
          std::vector<UniValue,_std::allocator<UniValue>_>::operator=(this_02,&local_b0.values);
        }
        else {
          local_110 = &local_100;
          std::vector<UniValue,_std::allocator<UniValue>_>::push_back
                    (&iStack_120._M_current[-1]->values,&local_b0);
        }
        std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_b0.values);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_b0.keys);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0.val._M_dataplus._M_p != &local_b0.val.field_2) {
          operator_delete(local_b0.val._M_dataplus._M_p,
                          local_b0.val.field_2._M_allocated_capacity + 1);
        }
        if (iVar5._M_current == ppUVar4) break;
      }
      bVar11 = bVar10 | 0x10;
    }
    bVar12 = true;
LAB_001e6f7a:
    if (!bVar12) {
LAB_001e6fb3:
      uVar9 = 0;
      goto LAB_001e6fb5;
    }
    __buf = (void *)((long)__buf + uVar9);
    jVar7 = jVar6;
    if (local_128 == iStack_120._M_current) {
      jVar7 = getJsonToken(&local_58,&local_12c,(char *)__buf,end);
      uVar9 = CONCAT71((int7)((ulong)end >> 8),jVar7 == JTOK_NONE);
LAB_001e6fb5:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p,
                        CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                                 local_58.field_2._M_local_buf[0]) + 1);
      }
      if (local_128 != (UniValue **)0x0) {
        operator_delete(local_128,(long)local_118 - (long)local_128);
      }
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        return uVar9 & 0xffffffff;
      }
      __stack_chk_fail();
    }
  } while( true );
}

Assistant:

bool UniValue::read(std::string_view str_in)
{
    clear();

    uint32_t expectMask = 0;
    std::vector<UniValue*> stack;

    std::string tokenVal;
    unsigned int consumed;
    enum jtokentype tok = JTOK_NONE;
    enum jtokentype last_tok = JTOK_NONE;
    const char* raw{str_in.data()};
    const char* end{raw + str_in.size()};
    do {
        last_tok = tok;

        tok = getJsonToken(tokenVal, consumed, raw, end);
        if (tok == JTOK_NONE || tok == JTOK_ERR)
            return false;
        raw += consumed;

        bool isValueOpen = jsonTokenIsValue(tok) ||
            tok == JTOK_OBJ_OPEN || tok == JTOK_ARR_OPEN;

        if (expect(VALUE)) {
            if (!isValueOpen)
                return false;
            clearExpect(VALUE);

        } else if (expect(ARR_VALUE)) {
            bool isArrValue = isValueOpen || (tok == JTOK_ARR_CLOSE);
            if (!isArrValue)
                return false;

            clearExpect(ARR_VALUE);

        } else if (expect(OBJ_NAME)) {
            bool isObjName = (tok == JTOK_OBJ_CLOSE || tok == JTOK_STRING);
            if (!isObjName)
                return false;

        } else if (expect(COLON)) {
            if (tok != JTOK_COLON)
                return false;
            clearExpect(COLON);

        } else if (!expect(COLON) && (tok == JTOK_COLON)) {
            return false;
        }

        if (expect(NOT_VALUE)) {
            if (isValueOpen)
                return false;
            clearExpect(NOT_VALUE);
        }

        switch (tok) {

        case JTOK_OBJ_OPEN:
        case JTOK_ARR_OPEN: {
            VType utyp = (tok == JTOK_OBJ_OPEN ? VOBJ : VARR);
            if (!stack.size()) {
                if (utyp == VOBJ)
                    setObject();
                else
                    setArray();
                stack.push_back(this);
            } else {
                UniValue tmpVal(utyp);
                UniValue *top = stack.back();
                top->values.push_back(tmpVal);

                UniValue *newTop = &(top->values.back());
                stack.push_back(newTop);
            }

            if (stack.size() > MAX_JSON_DEPTH)
                return false;

            if (utyp == VOBJ)
                setExpect(OBJ_NAME);
            else
                setExpect(ARR_VALUE);
            break;
            }

        case JTOK_OBJ_CLOSE:
        case JTOK_ARR_CLOSE: {
            if (!stack.size() || (last_tok == JTOK_COMMA))
                return false;

            VType utyp = (tok == JTOK_OBJ_CLOSE ? VOBJ : VARR);
            UniValue *top = stack.back();
            if (utyp != top->getType())
                return false;

            stack.pop_back();
            clearExpect(OBJ_NAME);
            setExpect(NOT_VALUE);
            break;
            }

        case JTOK_COLON: {
            if (!stack.size())
                return false;

            UniValue *top = stack.back();
            if (top->getType() != VOBJ)
                return false;

            setExpect(VALUE);
            break;
            }

        case JTOK_COMMA: {
            if (!stack.size() ||
                (last_tok == JTOK_COMMA) || (last_tok == JTOK_ARR_OPEN))
                return false;

            UniValue *top = stack.back();
            if (top->getType() == VOBJ)
                setExpect(OBJ_NAME);
            else
                setExpect(ARR_VALUE);
            break;
            }

        case JTOK_KW_NULL:
        case JTOK_KW_TRUE:
        case JTOK_KW_FALSE: {
            UniValue tmpVal;
            switch (tok) {
            case JTOK_KW_NULL:
                // do nothing more
                break;
            case JTOK_KW_TRUE:
                tmpVal.setBool(true);
                break;
            case JTOK_KW_FALSE:
                tmpVal.setBool(false);
                break;
            default: /* impossible */ break;
            }

            if (!stack.size()) {
                *this = tmpVal;
                break;
            }

            UniValue *top = stack.back();
            top->values.push_back(tmpVal);

            setExpect(NOT_VALUE);
            break;
            }

        case JTOK_NUMBER: {
            UniValue tmpVal(VNUM, tokenVal);
            if (!stack.size()) {
                *this = tmpVal;
                break;
            }

            UniValue *top = stack.back();
            top->values.push_back(tmpVal);

            setExpect(NOT_VALUE);
            break;
            }

        case JTOK_STRING: {
            if (expect(OBJ_NAME)) {
                UniValue *top = stack.back();
                top->keys.push_back(tokenVal);
                clearExpect(OBJ_NAME);
                setExpect(COLON);
            } else {
                UniValue tmpVal(VSTR, tokenVal);
                if (!stack.size()) {
                    *this = tmpVal;
                    break;
                }
                UniValue *top = stack.back();
                top->values.push_back(tmpVal);
            }

            setExpect(NOT_VALUE);
            break;
            }

        default:
            return false;
        }
    } while (!stack.empty ());

    /* Check that nothing follows the initial construct (parsed above).  */
    tok = getJsonToken(tokenVal, consumed, raw, end);
    if (tok != JTOK_NONE)
        return false;

    return true;
}